

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psocks.c
# Opt level: O3

void psocks_pw_check(void *ctx,pollwrapper *pw)

{
  uint uVar1;
  int iVar2;
  int status;
  int local_c;
  
  if (((-1 < signalpipe[0]) && (uVar1 = pollwrap_get_fd_rwx(pw,signalpipe[0]), (uVar1 & 1) != 0)) &&
     (iVar2 = waitpid(-1,&local_c,1), 0 < iVar2)) {
    do {
      if (iVar2 == subcommand_pid) {
        still_running = 1;
      }
      iVar2 = waitpid(-1,&local_c,1);
    } while (0 < iVar2);
  }
  return;
}

Assistant:

static void psocks_pw_check(void *ctx, pollwrapper *pw)
{
    if (signalpipe[0] >= 0 &&
        pollwrap_check_fd_rwx(pw, signalpipe[0], SELECT_R)) {
        while (true) {
            int status;
            pid_t pid = waitpid(-1, &status, WNOHANG);
            if (pid <= 0)
                break;
            if (pid == subcommand_pid)
                still_running = false;
        }
    }
}